

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeHierarchicSegment<double> *this,MatrixXd *refcoords)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Index IVar1;
  anon_class_1_0_00000001_for_op *func;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:306:11),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar2;
  RowXpr local_388;
  anon_class_8_1_54a39809_for_op local_350;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:306:11),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_348;
  uint local_334;
  undefined1 local_330 [4];
  int i;
  RowXpr local_2f8;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> local_2b9;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:301:29),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *local_2b8 [2];
  Index local_2a8;
  size_type local_2a0;
  undefined1 local_29a;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeHierarchicSegment<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeHierarchicSegment<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 == 1) {
    local_29a = 0;
    local_2a0 = NumRefShapeFunctions(this);
    local_2a8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,long>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2a0,&local_2a8);
    local_2b8[0] = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                   unaryExpr<lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions(Eigen::Matrix<double,_1,_1,0,_1,_1>const&)const::_lambda(double)_1_>
                             ((CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:301:29),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                               *)local_20,&local_2b9,func);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_2f8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_2f8,
               (DenseBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:301:29),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_2b8);
    other = local_20;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              ((RowXpr *)local_330,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)local_330,other);
    for (local_334 = 0; local_334 < this->degree_ - 1; local_334 = local_334 + 1) {
      local_350.i = (int *)&local_334;
      CVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              unaryExpr<lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions(Eigen::Matrix<double,_1,_1,0,_1,_1>const&)const::_lambda(double)_2_>
                        ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_20,&local_350);
      local_348 = CVar2;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_388,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
                 (long)(int)(local_334 + 2));
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_388,
                 (DenseBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:306:11),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_348);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"refcoords must be a row vector");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"refcoords.rows() == 1",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x128,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  lf::base::AssertionFailed(&local_248,&local_270,0x128,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd &refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 1, "refcoords must be a row vector");
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        NumRefShapeFunctions(), refcoords.cols());
    // Get the shape functions associated with the vertices
    result.row(0) =
        refcoords.unaryExpr([&](double x) -> SCALAR { return 1 - x; });
    result.row(1) = refcoords;
    // Get the shape functions associated with the interior of the segment
    for (int i = 0; i < degree_ - 1; ++i) {
      result.row(i + 2) = refcoords.unaryExpr(
          [&](double x) -> SCALAR { return ILegendre(i + 2, x); });
    }
    return result;
  }